

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joint.cpp
# Opt level: O2

void __thiscall
CMU462::DynamicScene::Joint::drag
          (Joint *this,double x,double y,double dx,double dy,Matrix4x4 *modelViewProj)

{
  double dVar1;
  long lVar2;
  Joint *j;
  Joint *pJVar3;
  Matrix4x4 *pMVar4;
  Matrix4x4 *pMVar5;
  byte bVar6;
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [8];
  double dStack_1c0;
  double w;
  Matrix4x4 local_1b0;
  Matrix4x4 T;
  Matrix4x4 local_b0;
  
  bVar6 = 0;
  local_1d8._0_8_ = (this->super_SceneObject).position.x;
  local_1d8._8_8_ = (this->super_SceneObject).position.y;
  local_1c8 = (undefined1  [8])(this->super_SceneObject).position.z;
  dStack_1c0 = 1.0;
  Matrix4x4::operator*(modelViewProj,(Vector4D *)local_1d8);
  local_1c8 = (undefined1  [8])T.entries[0].z;
  dStack_1c0 = T.entries[0].w;
  local_1d8._0_8_ = T.entries[0].x;
  local_1d8._8_8_ = T.entries[0].y;
  w = T.entries[0].w;
  Vector4D::operator/=((Vector4D *)local_1d8,&w);
  dVar1 = (dy + (double)local_1d8._8_8_) * w;
  local_1d8._8_4_ = SUB84(dVar1,0);
  local_1d8._0_8_ = (dx + (double)local_1d8._0_8_) * w;
  local_1d8._12_4_ = (int)((ulong)dVar1 >> 0x20);
  dVar1 = w * dStack_1c0;
  unique0x100000f6 = SUB84(dVar1,0);
  local_1c8 = (undefined1  [8])(w * (double)local_1c8);
  unique0x100000fa = (int)((ulong)dVar1 >> 0x20);
  Matrix4x4::inv(&T,modelViewProj);
  Matrix4x4::operator*(&T,(Vector4D *)local_1d8);
  Matrix4x4::identity();
  for (pJVar3 = this; pJVar3 != (Joint *)0x0; pJVar3 = pJVar3->parent) {
    (*(pJVar3->super_SceneObject)._vptr_SceneObject[0xc])(&local_b0,pJVar3);
    Matrix4x4::operator*(&local_1b0,&local_b0,&T);
    pMVar4 = &local_1b0;
    pMVar5 = &T;
    for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
      pMVar5->entries[0].x = pMVar4->entries[0].x;
      pMVar4 = (Matrix4x4 *)((long)pMVar4 + ((ulong)bVar6 * -2 + 1) * 8);
      pMVar5 = (Matrix4x4 *)((long)pMVar5 + ((ulong)bVar6 * -2 + 1) * 8);
    }
  }
  (*(this->skeleton->mesh->super_SceneObject)._vptr_SceneObject[0xc])(&local_b0);
  Matrix4x4::operator*(&local_1b0,&local_b0,&T);
  pMVar4 = &local_1b0;
  pMVar5 = &T;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    pMVar5->entries[0].x = pMVar4->entries[0].x;
    pMVar4 = (Matrix4x4 *)((long)pMVar4 + ((ulong)bVar6 * -2 + 1) * 8);
    pMVar5 = (Matrix4x4 *)((long)pMVar5 + ((ulong)bVar6 * -2 + 1) * 8);
  }
  Matrix4x4::inv(&local_1b0,&T);
  Matrix4x4::operator*(&local_1b0,(Vector4D *)local_1d8);
  if (this->skeleton->root == this) {
    Vector4D::to3D((Vector4D *)local_1d8);
    (this->super_SceneObject).position.z = local_1b0.entries[0].z;
    (this->super_SceneObject).position.x = local_1b0.entries[0].x;
    (this->super_SceneObject).position.y = local_1b0.entries[0].y;
  }
  else {
    Vector4D::to3D((Vector4D *)local_1d8);
    Vector3D::operator+=(&this->axis,(Vector3D *)&local_1b0);
  }
  return;
}

Assistant:

void Joint::drag(double x, double y, double dx, double dy, const Matrix4x4& modelViewProj)
   {
      Vector4D q(position, 1.);

      // Transform into clip space
      q = modelViewProj * q;
      double w = q.w;
      q /= w;

      // Shift by (dx, dy).
      q.x += dx;
      q.y += dy;

      // Transform back into model space
      q *= w;
      q = modelViewProj.inv() * q;

      Matrix4x4 T = Matrix4x4::identity();
      for (Joint* j = this; j != nullptr; j = j->parent)
      {
          T = j->getRotation() * T;
      }
      T = skeleton->mesh->getRotation() * T;
      q = T.inv() * q;

      if (skeleton->root == this)
         position = q.to3D();
      else
         axis += q.to3D();
   }